

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMAttrImpl::getTextValue(DOMAttrImpl *this,DOMNode *node,XMLBuffer *buf)

{
  int iVar1;
  undefined4 extraout_var;
  DOMNode *node_00;
  DOMChildNode *pDVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*node->_vptr_DOMNode[4])(node);
  if (iVar1 == 3) {
    iVar1 = (*node->_vptr_DOMNode[3])(node);
    XMLBuffer::append(buf,(XMLCh *)CONCAT44(extraout_var,iVar1));
    return;
  }
  iVar1 = (*node->_vptr_DOMNode[4])(node);
  if (iVar1 == 5) {
    iVar1 = (*node->_vptr_DOMNode[7])(node);
    node_00 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
    while (node_00 != (DOMNode *)0x0) {
      getTextValue(this,node_00,buf);
      pDVar2 = castToChildImpl(node_00);
      node_00 = pDVar2->nextSibling;
    }
  }
  return;
}

Assistant:

void DOMAttrImpl::getTextValue(DOMNode* node, XMLBuffer& buf) const
{
    if (node->getNodeType() == DOMNode::TEXT_NODE)
        buf.append(node->getNodeValue());
    else if (node->getNodeType() == DOMNode::ENTITY_REFERENCE_NODE)
    {
        for (node = node->getFirstChild(); node != 0; node = castToChildImpl(node)->nextSibling)
        {
            getTextValue(node, buf);
        }
    }

    return;
}